

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printSslCertificate(X509 *cert)

{
  BIGNUM *bn;
  C *pCVar1;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *this;
  X509 *in_RDI;
  BigNum bigNum;
  X509_name_st *issuerName;
  X509_name_st *subjectName;
  ASN1_TIME *notAfterTime;
  ASN1_TIME *notBeforeTime;
  ASN1_INTEGER *serialNumber;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff30;
  BigNum *in_stack_ffffffffffffff40;
  ASN1_INTEGER *ai;
  BigNum *in_stack_ffffffffffffff58;
  ASN1_TIME *in_stack_ffffffffffffff68;
  X509_name_st *in_stack_ffffffffffffffb0;
  Handle local_38 [8];
  X509_NAME *local_30;
  X509_NAME *local_28;
  undefined8 local_20;
  undefined8 local_18;
  ASN1_INTEGER *local_10;
  X509 *local_8;
  
  local_8 = in_RDI;
  local_10 = X509_get_serialNumber(in_RDI);
  local_18 = X509_getm_notBefore(local_8);
  local_20 = X509_getm_notAfter(local_8);
  local_28 = X509_get_subject_name(local_8);
  local_30 = X509_get_issuer_name(local_8);
  axl::cry::BigNum::BigNum(in_stack_ffffffffffffff40);
  axl::cry::BigNum::create((BigNum *)in_stack_ffffffffffffff30);
  ai = local_10;
  bn = (BIGNUM *)axl::sl::Handle::operator_cast_to_bignum_st_(local_38);
  ASN1_INTEGER_to_BN(ai,bn);
  axl::cry::BigNum::getHexString(in_stack_ffffffffffffff58);
  pCVar1 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                     (in_stack_ffffffffffffff30);
  printf("  serial:     %s\n",pCVar1);
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x11769c);
  axl::cry::getAsn1TimeString(in_stack_ffffffffffffff68);
  this = (StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
         axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz(in_stack_ffffffffffffff30)
  ;
  printf("  valid from: %s\n",this);
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x1176e0);
  axl::cry::getAsn1TimeString(in_stack_ffffffffffffff68);
  pCVar1 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz(this);
  printf("  valid to:   %s\n",pCVar1);
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x117722);
  printf("  subject:\n");
  printX509Name(in_stack_ffffffffffffffb0);
  printf("  issuer:\n");
  printX509Name(in_stack_ffffffffffffffb0);
  axl::cry::BigNum::~BigNum((BigNum *)0x11776d);
  return;
}

Assistant:

void
printSslCertificate(X509* cert) {
//	int result;

	ASN1_INTEGER* serialNumber = X509_get_serialNumber(cert);
	ASN1_TIME* notBeforeTime = X509_get_notBefore(cert);
	ASN1_TIME* notAfterTime = X509_get_notAfter(cert);
	X509_name_st* subjectName = X509_get_subject_name(cert);
	X509_name_st* issuerName = X509_get_issuer_name(cert);

	cry::BigNum bigNum;
	bigNum.create();
	ASN1_INTEGER_to_BN(serialNumber, bigNum);
	printf("  serial:     %s\n", bigNum.getHexString().sz());
	printf("  valid from: %s\n", cry::getAsn1TimeString(notBeforeTime).sz());
	printf("  valid to:   %s\n", cry::getAsn1TimeString(notAfterTime).sz());

	printf("  subject:\n");
	printX509Name(subjectName);

	printf("  issuer:\n");
	printX509Name(issuerName);
}